

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O3

void gf256_add2_mem(void *vz,void *vx,void *vy,int bytes)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  
  if (CpuHasAVX2) {
    uVar3 = bytes;
    if (bytes < 0) {
      uVar3 = bytes + 0x1fU;
    }
    uVar3 = (int)uVar3 >> 5;
    if (0x3e < bytes + 0x1fU) {
      lVar5 = 0;
      do {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)vy + lVar5),
                                     *(undefined1 (*) [32])((long)vx + lVar5),
                                     *(undefined1 (*) [32])((long)vz + lVar5),0x96);
        *(undefined1 (*) [32])((long)vz + lVar5) = auVar7;
        lVar5 = lVar5 + 0x20;
      } while ((ulong)(uVar3 + (uVar3 == 0)) << 5 != lVar5);
    }
    lVar5 = (ulong)uVar3 * 0x20;
    bytes = bytes + uVar3 * -0x20;
    vz = (void *)((long)vz + lVar5);
    vx = (void *)((long)vx + lVar5);
    vy = (void *)((long)vy + lVar5);
  }
  uVar3 = bytes;
  if (0xf < bytes) {
    do {
      auVar6 = *vx;
      auVar1 = *vy;
      bytes = uVar3 - 0x10;
      vx = (void *)((long)vx + 0x10);
      vy = (void *)((long)vy + 0x10);
      auVar6 = vpternlogq_avx512vl(auVar1,auVar6,*vz,0x96);
      *(undefined1 (*) [16])vz = auVar6;
      vz = (void *)((long)vz + 0x10);
      bVar2 = 0x1f < uVar3;
      uVar3 = bytes;
    } while (bVar2);
  }
  uVar3 = bytes & 8;
  if (uVar3 != 0) {
    *(ulong *)*(undefined1 (*) [16])vz =
         *(ulong *)*(undefined1 (*) [16])vz ^
         *(ulong *)*(undefined1 (*) [16])vy ^ *(ulong *)*(undefined1 (*) [16])vx;
  }
  if ((bytes & 4U) != 0) {
    *(uint *)(*(undefined1 (*) [16])vz + uVar3) =
         *(uint *)(*(undefined1 (*) [16])vz + uVar3) ^
         *(uint *)(*(undefined1 (*) [16])vy + uVar3) ^ *(uint *)(*(undefined1 (*) [16])vx + uVar3);
  }
  uVar4 = (ulong)(bytes & 0xc);
  switch(bytes & 3) {
  case 0:
    return;
  case 3:
    (*(undefined1 (*) [16])vz)[uVar4 + 2] =
         (*(undefined1 (*) [16])vz)[uVar4 + 2] ^
         (*(undefined1 (*) [16])vy)[uVar4 + 2] ^ (*(undefined1 (*) [16])vx)[uVar4 + 2];
  case 2:
    (*(undefined1 (*) [16])vz)[uVar4 + 1] =
         (*(undefined1 (*) [16])vz)[uVar4 + 1] ^
         (*(undefined1 (*) [16])vy)[uVar4 + 1] ^ (*(undefined1 (*) [16])vx)[uVar4 + 1];
  case 1:
    (*(undefined1 (*) [16])vz)[uVar4] =
         (*(undefined1 (*) [16])vz)[uVar4] ^
         (*(undefined1 (*) [16])vy)[uVar4] ^ (*(undefined1 (*) [16])vx)[uVar4];
    return;
  }
}

Assistant:

void gf256_add2_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx,
                               const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128*>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128*>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128*>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // z[i] = z[i] xor x[i] xor y[i]
            vst1q_u8((uint8_t*)z16,
                veorq_u8(
                    vld1q_u8((uint8_t*)z16),
                    veorq_u8(
                        vld1q_u8((uint8_t*)x16),
                        vld1q_u8((uint8_t*)y16))));

            bytes -= 16, ++x16, ++y16, ++z16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z16);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            z8[ii] ^= x8[ii] ^ y8[ii];

        z16 = reinterpret_cast<GF256_M128 *>(z8 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        const unsigned count = bytes / 32;
        for (unsigned i = 0; i < count; ++i)
        {
            _mm256_storeu_si256(z32 + i,
                _mm256_xor_si256(
                    _mm256_loadu_si256(z32 + i),
                    _mm256_xor_si256(
                        _mm256_loadu_si256(x32 + i),
                        _mm256_loadu_si256(y32 + i))));
        }

        bytes -= count * 32;
        z16 = reinterpret_cast<GF256_M128 *>(z32 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x32 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y32 + count);
    }
# endif // GF256_TRY_AVX2

    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // z[i] = z[i] xor x[i] xor y[i]
        _mm_storeu_si128(z16,
            _mm_xor_si128(
                _mm_loadu_si128(z16),
                _mm_xor_si128(
                    _mm_loadu_si128(x16),
                    _mm_loadu_si128(y16))));

        bytes -= 16, ++x16, ++y16, ++z16;
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t *>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *z8 ^= *x8 ^ *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1 + eight);
        const uint32_t * GF256_RESTRICT x4 = reinterpret_cast<const uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *z4 ^= *x4 ^ *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] ^= x1[offset + 2] ^ y1[offset + 2];
    case 2: z1[offset + 1] ^= x1[offset + 1] ^ y1[offset + 1];
    case 1: z1[offset] ^= x1[offset] ^ y1[offset];
    default:
        break;
    }
}